

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::FatalTask::~FatalTask(FatalTask *this)

{
  SystemSubroutine::~SystemSubroutine((SystemSubroutine *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

FatalTask() : SeverityTask(KnownSystemName::Fatal, ElabSystemTaskKind::Fatal) {
        neverReturns = true;
    }